

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O1

void AM_Ticker(void)

{
  if (automapactive) {
    amclock = amclock + 1;
    if (am_followplayer.Value) {
      AM_doFollowPlayer();
    }
    else {
      _ZL8m_paninc_1 = 0.0;
      _ZL8m_paninc_0 = 0.0;
      if (Button_AM_PanLeft.bDown != '\0') {
        _ZL8m_paninc_0 = scale_ftom * -4.0 + 0.0;
      }
      if (Button_AM_PanRight.bDown != '\0') {
        _ZL8m_paninc_0 = scale_ftom * 4.0 + _ZL8m_paninc_0;
      }
      if (Button_AM_PanUp.bDown != '\0') {
        _ZL8m_paninc_1 = scale_ftom * 4.0 + 0.0;
      }
      if (Button_AM_PanDown.bDown != '\0') {
        _ZL8m_paninc_1 = scale_ftom * -4.0 + _ZL8m_paninc_1;
      }
    }
    if ((((Button_AM_ZoomIn.bDown != '\0') || (Button_AM_ZoomOut.bDown != '\0')) ||
        (am_zoomdir != 0.0)) || (NAN(am_zoomdir))) {
      AM_changeWindowScale();
    }
    AM_changeWindowLoc();
    return;
  }
  return;
}

Assistant:

void AM_Ticker ()
{
	if (!automapactive)
		return;

	amclock++;

	if (am_followplayer)
	{
		AM_doFollowPlayer();
	}
	else
	{
		m_paninc.x = m_paninc.y = 0;
		if (Button_AM_PanLeft.bDown) m_paninc.x -= FTOM(F_PANINC);
		if (Button_AM_PanRight.bDown) m_paninc.x += FTOM(F_PANINC);
		if (Button_AM_PanUp.bDown) m_paninc.y += FTOM(F_PANINC);
		if (Button_AM_PanDown.bDown) m_paninc.y -= FTOM(F_PANINC);
	}

	// Change the zoom if necessary
	if (Button_AM_ZoomIn.bDown || Button_AM_ZoomOut.bDown || am_zoomdir != 0)
		AM_changeWindowScale();

	// Change x,y location
	//if (m_paninc.x || m_paninc.y)
		AM_changeWindowLoc();
}